

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::ExtPrivkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPrivkey *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  ExtPrivkey privkey;
  Extkey local_a0;
  
  DerivePrivkey((ExtPrivkey *)&local_a0,this,path);
  GetExtPubkey(__return_storage_ptr__,(ExtPrivkey *)&local_a0);
  Extkey::~Extkey(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPrivkey::DerivePubkey(const std::vector<uint32_t>& path) const {
  ExtPrivkey privkey = DerivePrivkey(path);
  return privkey.GetExtPubkey();
}